

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcRoof::IfcRoof(IfcRoof *this)

{
  IfcRoof *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x178,"IfcRoof");
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00f8cec0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>,
             &PTR_construction_vtable_24__00f8cff8);
  *(undefined8 *)this = 0xf8cd90;
  *(undefined8 *)&this->field_0x178 = 0xf8cea8;
  *(undefined8 *)&this->field_0x88 = 0xf8cdb8;
  *(undefined8 *)&this->field_0x98 = 0xf8cde0;
  *(undefined8 *)&this->field_0xd0 = 0xf8ce08;
  *(undefined8 *)&this->field_0x100 = 0xf8ce30;
  *(undefined8 *)&this->field_0x138 = 0xf8ce58;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xf8ce80;
  std::__cxx11::string::string
            ((string *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>).field_0x10
            );
  return;
}

Assistant:

IfcRoof() : Object("IfcRoof") {}